

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.cpp
# Opt level: O1

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* spvtools::utils::SplitFlagArgs
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,string *flag)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  size_type *psVar3;
  size_type *psVar4;
  _Alloc_hider _Var5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  _Alloc_hider local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  _Alloc_hider local_68;
  size_type local_60;
  size_type local_58;
  undefined8 uStack_50;
  size_type *local_48;
  size_type local_40;
  undefined1 local_38;
  uint7 uStack_37;
  undefined8 uStack_30;
  
  if (flag->_M_string_length < 2) {
    local_a8._M_string_length = 0;
    local_a8.field_2._M_local_buf[0] = '\0';
    local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,flag,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
      return __return_storage_ptr__;
    }
  }
  else {
    lVar2 = std::__cxx11::string::find((char)flag,0x3d);
    if (lVar2 == -1) {
      std::__cxx11::string::substr((ulong)&local_88,(ulong)flag);
      psVar3 = (size_type *)&local_38;
      local_40 = 0;
      local_38 = 0;
      paVar1 = &(__return_storage_ptr__->first).field_2;
      (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_p == &local_78) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]);
        *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_78._8_8_;
      }
      else {
        (__return_storage_ptr__->first)._M_dataplus._M_p = local_88._M_p;
        (__return_storage_ptr__->first).field_2._M_allocated_capacity =
             CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]);
      }
      psVar4 = &local_40;
      (__return_storage_ptr__->first)._M_string_length = local_80;
      local_60 = 0;
      local_80 = 0;
      local_78._M_local_buf[0] = '\0';
      (__return_storage_ptr__->second)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->second).field_2;
      (__return_storage_ptr__->second).field_2._M_allocated_capacity = (ulong)uStack_37 << 8;
      *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = uStack_30;
      local_88._M_p = (pointer)&local_78;
      local_48 = psVar3;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_a8,(ulong)flag);
      std::__cxx11::string::substr((ulong)&local_68,(ulong)flag);
      paVar1 = &(__return_storage_ptr__->first).field_2;
      (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
        paVar1->_M_allocated_capacity =
             CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,local_a8.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&(__return_storage_ptr__->first).field_2 + 8) = local_a8.field_2._8_8_
        ;
      }
      else {
        (__return_storage_ptr__->first)._M_dataplus._M_p = local_a8._M_dataplus._M_p;
        (__return_storage_ptr__->first).field_2._M_allocated_capacity =
             CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,local_a8.field_2._M_local_buf[0])
        ;
      }
      (__return_storage_ptr__->first)._M_string_length = local_a8._M_string_length;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_local_buf[0] = '\0';
      paVar1 = &(__return_storage_ptr__->second).field_2;
      (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar1;
      psVar3 = &local_58;
      if ((size_type *)local_68._M_p == psVar3) {
        paVar1->_M_allocated_capacity = local_58;
        *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = uStack_50;
      }
      else {
        (__return_storage_ptr__->second)._M_dataplus._M_p = local_68._M_p;
        (__return_storage_ptr__->second).field_2._M_allocated_capacity = local_58;
      }
      psVar4 = &local_60;
      local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
    }
    (__return_storage_ptr__->second)._M_string_length = local_60;
    psVar4[-1] = (size_type)psVar3;
    *psVar4 = 0;
    *(undefined1 *)psVar3 = 0;
    if (lVar2 == -1) {
      if (local_48 != (size_type *)&local_38) {
        operator_delete(local_48,CONCAT71(uStack_37,local_38) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_p == &local_78) {
        return __return_storage_ptr__;
      }
      lVar2 = CONCAT71(local_78._M_allocated_capacity._1_7_,local_78._M_local_buf[0]);
      _Var5._M_p = local_88._M_p;
      goto LAB_005e62e1;
    }
    if ((size_type *)local_68._M_p != &local_58) {
      operator_delete(local_68._M_p,local_58 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
      return __return_storage_ptr__;
    }
  }
  lVar2 = CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,local_a8.field_2._M_local_buf[0]);
  _Var5._M_p = local_a8._M_dataplus._M_p;
LAB_005e62e1:
  operator_delete(_Var5._M_p,lVar2 + 1);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::string, std::string> SplitFlagArgs(const std::string& flag) {
  if (flag.size() < 2) return make_pair(flag, std::string());

  // Detect the last dash before the pass name. Since we have to
  // handle single dash options (-O and -Os), count up to two dashes.
  size_t dash_ix = 0;
  if (flag[0] == '-' && flag[1] == '-')
    dash_ix = 2;
  else if (flag[0] == '-')
    dash_ix = 1;

  size_t ix = flag.find('=');
  return (ix != std::string::npos)
             ? make_pair(flag.substr(dash_ix, ix - 2), flag.substr(ix + 1))
             : make_pair(flag.substr(dash_ix), std::string());
}